

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O1

void __thiscall
CVmObjByteArray::move_bytes
          (CVmObjByteArray *this,unsigned_long dst_idx,unsigned_long src_idx,unsigned_long cnt)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  void *pvVar7;
  ulong uVar8;
  unsigned_long local_48;
  
  if (dst_idx < src_idx) {
    uVar3 = src_idx - 1;
    uVar8 = 0x8000 - (uVar3 & 0x7fff);
    pcVar1 = (this->super_CVmObject).ext_;
    pvVar7 = (void *)((uVar3 & 0x7fff) +
                     *(long *)(*(long *)(pcVar1 + (uVar3 >> 0x1c) * 8 + 4) +
                              (ulong)((uint)(uVar3 >> 0xc) & 0xfff8)));
    uVar3 = dst_idx - 1;
    uVar5 = 0x8000 - (uVar3 & 0x7fff);
    pvVar4 = (void *)((uVar3 & 0x7fff) +
                     *(long *)(*(long *)(pcVar1 + (uVar3 >> 0x1c) * 8 + 4) +
                              (ulong)((uint)(uVar3 >> 0xc) & 0xfff8)));
    local_48 = dst_idx;
    do {
      if (cnt == 0) {
        return;
      }
      uVar3 = uVar8;
      if (cnt < uVar8) {
        uVar3 = cnt;
      }
      if (uVar5 <= uVar3) {
        uVar3 = uVar5;
      }
      memmove(pvVar4,pvVar7,uVar3);
      pvVar7 = (void *)((long)pvVar7 + uVar3);
      pvVar4 = (void *)((long)pvVar4 + uVar3);
      uVar8 = uVar8 - uVar3;
      uVar5 = uVar5 - uVar3;
      src_idx = src_idx + uVar3;
      local_48 = local_48 + uVar3;
      cnt = cnt - uVar3;
      if (cnt != 0) {
        if (uVar8 == 0) {
          uVar2 = (uint)(src_idx - 1);
          uVar3 = (ulong)(uVar2 & 0x7fff);
          uVar8 = 0x8000 - uVar3;
          pvVar7 = (void *)(uVar3 + *(long *)(*(long *)((this->super_CVmObject).ext_ +
                                                       (src_idx - 1 >> 0x1c) * 8 + 4) +
                                             (ulong)(uVar2 >> 0xc & 0xfff8)));
        }
        if (uVar5 == 0) {
          uVar2 = (uint)(local_48 - 1);
          uVar3 = (ulong)(uVar2 & 0x7fff);
          uVar5 = 0x8000 - uVar3;
          pvVar4 = (void *)(uVar3 + *(long *)(*(long *)((this->super_CVmObject).ext_ +
                                                       (local_48 - 1 >> 0x1c) * 8 + 4) +
                                             (ulong)(uVar2 >> 0xc & 0xfff8)));
        }
      }
    } while (cnt != 0);
  }
  else {
    lVar6 = cnt + src_idx;
    local_48 = cnt + dst_idx;
    uVar3 = (cnt + src_idx) - 2;
    pcVar1 = (this->super_CVmObject).ext_;
    pvVar7 = (void *)(*(long *)(*(long *)(pcVar1 + (uVar3 >> 0x1c) * 8 + 4) +
                               (ulong)((uint)(uVar3 >> 0xc) & 0xfff8)) + (uVar3 & 0x7fff) + 1);
    uVar5 = (cnt + dst_idx) - 2;
    pvVar4 = (void *)(*(long *)(*(long *)(pcVar1 + (uVar5 >> 0x1c) * 8 + 4) +
                               (ulong)((uint)(uVar5 >> 0xc) & 0xfff8)) + (uVar5 & 0x7fff) + 1);
    uVar3 = (uVar3 | 0xffffffffffff8000) + 0x8001;
    uVar5 = (uVar5 | 0xffffffffffff8000) + 0x8001;
    do {
      if (cnt == 0) {
        return;
      }
      uVar8 = uVar3;
      if (cnt < uVar3) {
        uVar8 = cnt;
      }
      if (uVar5 <= uVar8) {
        uVar8 = uVar5;
      }
      pvVar4 = (void *)((long)pvVar4 - uVar8);
      pvVar7 = (void *)((long)pvVar7 - uVar8);
      memmove(pvVar4,pvVar7,uVar8);
      uVar3 = uVar3 - uVar8;
      uVar5 = uVar5 - uVar8;
      lVar6 = lVar6 - uVar8;
      local_48 = local_48 - uVar8;
      cnt = cnt - uVar8;
      if (cnt != 0) {
        if (uVar3 == 0) {
          uVar3 = lVar6 - 2;
          pvVar7 = (void *)(*(long *)(*(long *)((this->super_CVmObject).ext_ +
                                               (uVar3 >> 0x1c) * 8 + 4) +
                                     (ulong)((uint)uVar3 >> 0xc & 0xfff8)) +
                            (ulong)((uint)uVar3 & 0x7fff) + 1);
          uVar3 = (uVar3 | 0xffffffffffff8000) + 0x8001;
        }
        if (uVar5 == 0) {
          uVar5 = local_48 - 2;
          pvVar4 = (void *)(*(long *)(*(long *)((this->super_CVmObject).ext_ +
                                               (uVar5 >> 0x1c) * 8 + 4) +
                                     (ulong)((uint)uVar5 >> 0xc & 0xfff8)) +
                            (ulong)((uint)uVar5 & 0x7fff) + 1);
          uVar5 = (uVar5 | 0xffffffffffff8000) + 0x8001;
        }
      }
    } while (cnt != 0);
  }
  return;
}

Assistant:

void CVmObjByteArray::move_bytes(unsigned long dst_idx,
                                 unsigned long src_idx,
                                 unsigned long cnt)
{
    size_t src_avail;
    size_t dst_avail;
    unsigned char *srcp;
    unsigned char *dstp;

    /* 
     *   If the destination is before the source, we're moving bytes down,
     *   so we must start at the low end and work forwards through the
     *   array.  If the destination is after the source, we're moving bytes
     *   up, so we must start at the high end and work backwards through the
     *   array.  
     */
    if (dst_idx < src_idx)
    {

        /* 
         *   Moving bytes down in the array - start at the low end and work
         *   forwards through the array.  Get the starting pointers and
         *   available lengths.  
         */
        srcp = get_ele_ptr(src_idx, &src_avail);
        dstp = get_ele_ptr(dst_idx, &dst_avail);

        /* keep going until we've moved all of the bytes requested */
        while (cnt != 0)
        {
            size_t move_len;

            /* 
             *   figure the largest amount we can move - we can move the
             *   smallest of the remaining requested move size, the source
             *   chunk, and the destination chunk 
             */
            move_len = cnt;
            if (move_len > src_avail)
                move_len = src_avail;
            if (move_len > dst_avail)
                move_len = dst_avail;

            /* move the data */
            memmove(dstp, srcp, move_len);

            /* advance all of the counters by the move size */
            srcp += move_len;
            dstp += move_len;
            cnt -= move_len;
            src_avail -= move_len;
            dst_avail -= move_len;
            src_idx += move_len;
            dst_idx += move_len;

            /* stop if we're done */
            if (cnt == 0)
                break;

            /* if the source chunk is at an end, get the next one */
            if (src_avail == 0)
                srcp = get_ele_ptr(src_idx, &src_avail);

            /* if the destination chunk is at an end, get the next one */
            if (dst_avail == 0)
                dstp = get_ele_ptr(dst_idx, &dst_avail);
        }
    }
    else
    {
        /* 
         *   We're to move bytes up in the array - start at the high end and
         *   work backwards through the array.  Advance each index to one
         *   past the last byte of its range.  
         */
        src_idx += cnt;
        dst_idx += cnt;

        /* get the chunk pointers */
        srcp = get_ele_ptr(src_idx - 1, &src_avail) + 1;
        dstp = get_ele_ptr(dst_idx - 1, &dst_avail) + 1;

        /* 
         *   since we're working backwards, we actually want to know the
         *   number of bytes on the page *before* the current pointers, so
         *   subtract the available spaces from the size of the page to get
         *   the available space preceding each 
         */
        src_avail = 32*1024 - src_avail + 1;
        dst_avail = 32*1024 - dst_avail + 1;

        /* keep going until we've moved all of the requested bytes */
        while (cnt != 0)
        {
            size_t move_len;

            /* 
             *   figure the largest amount we can move - we can move the
             *   smallest of the remaining requested move size, the source
             *   chunk, and the destination chunk 
             */
            move_len = cnt;
            if (move_len > src_avail)
                move_len = src_avail;
            if (move_len > dst_avail)
                move_len = dst_avail;

            /* move the data */
            memmove(dstp - move_len, srcp - move_len, move_len);

            /* advance all of the counters by the move size */
            srcp -= move_len;
            dstp -= move_len;
            cnt -= move_len;
            src_avail -= move_len;
            dst_avail -= move_len;
            src_idx -= move_len;
            dst_idx -= move_len;

            /* stop if we're done */
            if (cnt == 0)
                break;

            /* if we've exhausted the source chunk, get the next one */
            if (src_avail == 0)
            {
                srcp = get_ele_ptr(src_idx - 1, &src_avail) + 1;
                src_avail = 32*1024 - src_avail + 1;
            }

            /* if we've exhausted the destination chunk, get the next one */
            if (dst_avail == 0)
            {
                dstp = get_ele_ptr(dst_idx - 1, &dst_avail) + 1;
                dst_avail = 32*1024 - dst_avail + 1;
            }
        }
    }
}